

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs6ReplaceImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              JavascriptString *replace,bool noResult)

{
  size_t size;
  uint uVar1;
  uint uVar2;
  char16 cVar3;
  Recycler *this;
  RecyclableObject *pRVar4;
  RecyclableObject *aValue;
  code *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  ushort uVar8;
  int iVar9;
  charcount_t cVar10;
  CharCount CVar11;
  BOOL BVar12;
  charcount_t cVar13;
  uint uVar14;
  charcount_t cVar15;
  charcount_t cVar16;
  uint uVar17;
  CharCount CVar18;
  Recycler *pRVar19;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Var pvVar20;
  JavascriptString *pJVar21;
  TempArenaAllocatorObject *tempAllocator;
  undefined4 *puVar22;
  int64 iVar23;
  JavascriptString *pJVar24;
  char16 *pcVar25;
  char16 *pcVar26;
  ushort uVar27;
  CharCount CVar28;
  CharCount CVar29;
  ulong uVar30;
  long lVar31;
  ScriptContext *input_00;
  ulong uVar32;
  ulong uVar33;
  char *addr;
  ulong uVar34;
  undefined1 local_338 [8];
  Builder<256U> accumulatedResultBuilder;
  TrackAllocData data_1;
  char *local_70;
  CharCount substringLength;
  
  bVar7 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar7) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
  }
  this = scriptContext->recycler;
  local_338 = (undefined1  [8])
              &JsUtil::
               List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
               ::typeinfo;
  accumulatedResultBuilder.buffer[0] = (void *)0x0;
  accumulatedResultBuilder.buffer[1] = &DAT_ffffffffffffffff;
  accumulatedResultBuilder.buffer[2] = anon_var_dwarf_8b6cc98;
  accumulatedResultBuilder.buffer[3]._0_4_ = 0x3fd;
  pRVar19 = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_338);
  this_00 = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,pRVar19,0x38bbb2);
  CVar18 = 0;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (WriteBarrierPtr<Js::RecyclableObject> *)0x0;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).count = 0
  ;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).alloc =
       this;
  (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_0154a8c0;
  this_00->length = 0;
  this_00->increment = 4;
  pvVar20 = JavascriptRegExp::CallExec
                      (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
  iVar9 = JavascriptOperators::IsNull(pvVar20);
  while (iVar9 == 0) {
    local_338 = (undefined1  [8])ExecResultToRecyclableObject(pvVar20);
    JsUtil::
    List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(this_00,(RecyclableObject **)local_338);
    if (!bVar7) break;
    pvVar20 = JavascriptOperators::GetItem((RecyclableObject *)local_338,0,scriptContext);
    input_00 = scriptContext;
    pJVar21 = JavascriptConversion::ToString(pvVar20,scriptContext);
    AdvanceLastIndex(thisObj,(JavascriptString *)input_00,pJVar21,false,scriptContext);
    pvVar20 = JavascriptRegExp::CallExec
                        (thisObj,input,L"RegExp.prototype[Symbol.replace]",scriptContext);
    iVar9 = JavascriptOperators::IsNull(pvVar20);
  }
  CompoundString::Builder<256U>::Builder((Builder<256U> *)local_338,scriptContext);
  cVar10 = JavascriptString::GetLength(input);
  tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexHelper");
  if (0 < (this_00->super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).
          count) {
    CVar18 = 0;
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_70 = (char *)0x0;
    lVar31 = 0;
    uVar30 = 0;
    do {
      pRVar4 = (this_00->
               super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>).buffer
               .ptr[lVar31].ptr;
      pvVar20 = JavascriptOperators::GetProperty(pRVar4,0xd1,scriptContext,(PropertyValueInfo *)0x0)
      ;
      iVar23 = JavascriptConversion::ToLength(pvVar20,scriptContext);
      uVar33 = iVar23 - 1;
      uVar34 = 0;
      if (0 < (long)uVar33) {
        uVar34 = uVar33;
      }
      pvVar20 = JavascriptOperators::GetItem(pRVar4,0,scriptContext);
      pJVar21 = JavascriptConversion::ToString(pvVar20,scriptContext);
      pvVar20 = JavascriptOperators::GetProperty
                          (pRVar4,0x1da,scriptContext,(PropertyValueInfo *)0x0);
      iVar23 = JavascriptConversion::ToLength(pvVar20,scriptContext);
      CVar11 = JavascriptRegExp::GetIndexOrMax(iVar23);
      if (cVar10 <= CVar11) {
        CVar11 = cVar10;
      }
      uVar32 = 99;
      if ((long)uVar34 < 99) {
        uVar32 = uVar34;
      }
      if (local_70 == (char *)0x0) {
        accumulatedResultBuilder._544_8_ = &Memory::WriteBarrierPtr<void>::typeinfo;
        pRVar19 = Memory::Recycler::TrackAllocInfo
                            (this,(TrackAllocData *)&accumulatedResultBuilder.isFinalized);
        BVar12 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar12 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar22 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar7) goto LAB_00d4cf0e;
          *puVar22 = 0;
        }
        size = uVar32 * 8 + 8;
        local_70 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                             (pRVar19,size);
        if (local_70 == (char *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar22 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar7) goto LAB_00d4cf0e;
          *puVar22 = 0;
        }
        memset(local_70,0,size);
      }
      else if (uVar32 != uVar30) {
        local_70 = Memory::Recycler::Realloc(this,local_70,uVar30 * 8 + 8,uVar32 * 8 + 8,true);
      }
      if (0 < (long)uVar33) {
        uVar30 = 1;
        addr = local_70;
        do {
          addr = addr + 8;
          pJVar24 = (JavascriptString *)JavascriptOperators::GetItem(pRVar4,uVar30,scriptContext);
          BVar12 = JavascriptOperators::IsUndefined(pJVar24);
          if (BVar12 == 0) {
            pJVar24 = JavascriptConversion::ToString(pJVar24,scriptContext);
          }
          if (uVar30 <= uVar32) {
            Memory::Recycler::WBSetBit(addr);
            *(JavascriptString **)addr = pJVar24;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          }
          bVar7 = uVar30 != uVar34;
          uVar30 = uVar30 + 1;
        } while (bVar7);
      }
      if (CVar18 <= CVar11) {
        if (accumulatedResultBuilder._520_8_ == 0) {
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    (input,CVar18,CVar11 - CVar18,(Builder<256U> *)local_338,false);
        }
        else {
          CompoundString::Append
                    ((CompoundString *)accumulatedResultBuilder._520_8_,input,CVar18,CVar11 - CVar18
                    );
        }
        accumulatedResultBuilder.isFinalized = false;
        accumulatedResultBuilder._545_7_ = 0;
        pcVar25 = JavascriptString::GetString(replace);
        cVar13 = JavascriptString::GetLength(replace);
        uVar14 = GetReplaceSubstitutions
                           (pcVar25,cVar13,&tempAllocator->allocator,
                            (CharCount **)&accumulatedResultBuilder.isFinalized);
        cVar13 = JavascriptString::GetLength(pJVar21);
        pcVar25 = JavascriptString::GetString(pJVar21);
        uVar6 = accumulatedResultBuilder._544_8_;
        pRVar4 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        cVar15 = JavascriptString::GetLength(input);
        pcVar26 = JavascriptString::GetString(replace);
        cVar16 = JavascriptString::GetLength(replace);
        if ((int)uVar14 < 1) {
          CVar18 = 0;
        }
        else {
          uVar17 = CVar11 + cVar13;
          uVar34 = 0;
          uVar30 = 0;
          do {
            CVar18 = *(CharCount *)(uVar6 + uVar34 * 4);
            CVar28 = (CharCount)uVar30;
            if (accumulatedResultBuilder._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (replace,CVar28,CVar18 - CVar28,(Builder<256U> *)local_338,false);
            }
            else {
              CompoundString::Append
                        ((CompoundString *)accumulatedResultBuilder._520_8_,replace,CVar28,
                         CVar18 - CVar28);
            }
            uVar30 = (ulong)(CVar18 + 1);
            cVar3 = pcVar26[uVar30];
            uVar8 = cVar3 + L'￐';
            if (uVar8 < 10) {
              uVar1 = CVar18 + 2;
              uVar30 = (ulong)uVar1;
              if ((uVar1 < cVar16) && ((ushort)(pcVar26[uVar1] + L'￐') < 10)) {
                uVar27 = pcVar26[uVar1] + L'￐' + uVar8 * 10;
                uVar2 = CVar18 + 3;
                if (uVar32 < uVar27) {
                  uVar2 = uVar1;
                  uVar27 = uVar8;
                }
                uVar8 = uVar27;
                uVar30 = (ulong)uVar2;
              }
              if (uVar8 == 0 || uVar32 < uVar8) {
                CVar28 = (int)uVar30 - CVar18;
                if (accumulatedResultBuilder._520_8_ == 0) {
LAB_00d4cbd6:
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (replace,CVar18,CVar28,(Builder<256U> *)local_338,false);
                }
                else {
LAB_00d4cb77:
                  CompoundString::Append
                            ((CompoundString *)accumulatedResultBuilder._520_8_,replace,CVar18,
                             CVar28);
                }
              }
              else {
                aValue = *(RecyclableObject **)(local_70 + (ulong)uVar8 * 8);
                bVar7 = VarIs<Js::JavascriptString>(aValue);
                if (bVar7) {
                  pJVar24 = UnsafeVarTo<Js::JavascriptString>(aValue);
                  if (accumulatedResultBuilder._520_8_ == 0) {
                    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                              (pJVar24,(Builder<256U> *)local_338,false);
                  }
                  else {
                    CompoundString::Append
                              ((CompoundString *)accumulatedResultBuilder._520_8_,pJVar24);
                  }
                }
                else if (aValue != pRVar4) {
                  CVar28 = (int)uVar30 - CVar18;
                  if (accumulatedResultBuilder._520_8_ != 0) goto LAB_00d4cb77;
                  goto LAB_00d4cbd6;
                }
              }
            }
            else {
              if ((ushort)cVar3 < 0x27) {
                if (cVar3 == L'$') {
                  if (accumulatedResultBuilder._520_8_ == 0) {
                    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                              (L'$',(Builder<256U> *)local_338,false);
                  }
                  else {
                    CompoundString::Append((CompoundString *)accumulatedResultBuilder._520_8_,L'$');
                  }
                }
                else {
                  if (cVar3 != L'&') {
LAB_00d4cbee:
                    if (accumulatedResultBuilder._520_8_ == 0) {
                      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                                (L'$',(Builder<256U> *)local_338,false);
                    }
                    else {
                      CompoundString::Append
                                ((CompoundString *)accumulatedResultBuilder._520_8_,L'$');
                    }
                    goto LAB_00d4cdbd;
                  }
                  if (accumulatedResultBuilder._520_8_ == 0) {
                    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                              (pcVar25,cVar13,(Builder<256U> *)local_338,false);
                  }
                  else {
                    CompoundString::Append
                              ((CompoundString *)accumulatedResultBuilder._520_8_,pcVar25,cVar13);
                  }
                }
              }
              else if (cVar3 == L'\'') {
                if (cVar13 == 0xffffffff) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar22 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                              ,0x60a,"(length != CharCountFlag)",
                                              "length != CharCountFlag");
                  if (!bVar7) goto LAB_00d4cf0e;
                  *puVar22 = 0;
                }
                if (uVar17 < cVar15) {
                  if (cVar13 == 0xffffffff) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar22 = 1;
                    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                                ,0x60a,"(length != CharCountFlag)",
                                                "length != CharCountFlag");
                    if (!bVar7) goto LAB_00d4cf0e;
                    *puVar22 = 0;
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar22 = 1;
                    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                                ,0x60a,"(length != CharCountFlag)",
                                                "length != CharCountFlag");
                    if (!bVar7) goto LAB_00d4cf0e;
                    *puVar22 = 0;
                  }
                  CVar28 = uVar17;
                  CVar29 = cVar15 - uVar17;
                  if (accumulatedResultBuilder._520_8_ != 0) goto LAB_00d4cd3f;
LAB_00d4cdab:
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (input,CVar28,CVar29,(Builder<256U> *)local_338,false);
                }
              }
              else {
                if (cVar3 != L'`') goto LAB_00d4cbee;
                if (accumulatedResultBuilder._520_8_ == 0) {
                  CVar28 = 0;
                  CVar29 = CVar11;
                  goto LAB_00d4cdab;
                }
                CVar28 = 0;
                CVar29 = CVar11;
LAB_00d4cd3f:
                CompoundString::Append
                          ((CompoundString *)accumulatedResultBuilder._520_8_,input,CVar28,CVar29);
              }
              uVar30 = (ulong)(CVar18 + 2);
            }
LAB_00d4cdbd:
            CVar18 = (CharCount)uVar30;
            uVar34 = uVar34 + 1;
          } while (uVar14 != uVar34);
        }
        if (accumulatedResultBuilder._520_8_ == 0) {
          CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                    (replace,CVar18,cVar16 - CVar18,(Builder<256U> *)local_338,false);
        }
        else {
          CompoundString::Append
                    ((CompoundString *)accumulatedResultBuilder._520_8_,replace,CVar18,
                     cVar16 - CVar18);
        }
        cVar13 = JavascriptString::GetLength(pJVar21);
        CVar18 = JavascriptRegExp::AddIndex(CVar11,cVar13);
      }
      lVar31 = lVar31 + 1;
      uVar30 = uVar32;
    } while (lVar31 < (this_00->
                      super_ReadOnlyList<Js::RecyclableObject_*,_Memory::Recycler,_DefaultComparer>)
                      .count);
  }
  ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
  CVar11 = cVar10 - CVar18;
  if (CVar18 <= cVar10 && CVar11 != 0) {
    if (accumulatedResultBuilder._520_8_ == 0) {
      CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                (input,CVar18,CVar11,(Builder<256U> *)local_338,false);
    }
    else {
      CompoundString::Append((CompoundString *)accumulatedResultBuilder._520_8_,input,CVar18,CVar11)
      ;
    }
  }
  pJVar21 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_338);
  if (pJVar21 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar22 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x45f,"(accumulatedResult != nullptr)",
                                "accumulatedResult != nullptr");
    if (!bVar7) {
LAB_00d4cf0e:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar22 = 0;
  }
  return pJVar21;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        auto appendReplacement = [&](
            CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& resultBuilder,
            ArenaAllocator* tempAlloc,
            JavascriptString* matchStr,
            int numberOfCaptures,
            Field(Var)* captures,
            CharCount position)
        {
            CharCount* substitutionOffsets = nullptr;
            int substitutions = GetReplaceSubstitutions(
                replace->GetString(),
                replace->GetLength(),
                tempAlloc,
                &substitutionOffsets);
            auto getGroup = [&](int captureIndex, Var nonMatchValue) {
                return captureIndex <= numberOfCaptures ? PointerValue(captures[captureIndex]) : nonMatchValue;
            };
            UnifiedRegex::GroupInfo match(position, matchStr->GetLength());
            int numGroups = numberOfCaptures + 1; // Take group 0 into account.
            ReplaceFormatString(
                scriptContext,
                numGroups,
                getGroup,
                input,
                matchStr->GetString(),
                match,
                replace,
                substitutions,
                substitutionOffsets,
                resultBuilder);
        };
        return RegexEs6ReplaceImpl(scriptContext, thisObj, input, appendReplacement, noResult);
    }